

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O2

size_t wasm::FunctionHasher::flexibleHashFunction(Function *func,ExprHasher *customHasher)

{
  Expression *curr;
  size_t sVar1;
  pointer pTVar2;
  size_t sVar3;
  function<bool_(wasm::Expression_*,_unsigned_long_&)> local_50;
  
  sVar1 = hash<wasm::HeapType>(&func->type);
  for (pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 != (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    sVar1 = sVar1 ^ sVar1 * 0x1000 + -0x61c8864680b583eb + (sVar1 >> 4) + pTVar2->id;
  }
  curr = func->body;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function(&local_50,customHasher);
  sVar3 = ExpressionAnalyzer::flexibleHash(curr,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return sVar1 * 0x1000 + -0x61c8864680b583eb + (sVar1 >> 4) + sVar3 ^ sVar1;
}

Assistant:

static size_t
  flexibleHashFunction(Function* func,
                       ExpressionAnalyzer::ExprHasher customHasher) {
    auto digest = hash(func->type);
    for (auto type : func->vars) {
      rehash(digest, type.getID());
    }
    hash_combine(digest,
                 ExpressionAnalyzer::flexibleHash(func->body, customHasher));
    return digest;
  }